

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

void __thiscall Propagator::init_compatible(Propagator *this)

{
  reference this_00;
  size_type sVar1;
  reference pvVar2;
  array<int,_4UL> *paVar3;
  Array3D<std::array<int,_4UL>_> *in_RDI;
  int direction;
  uint pattern;
  uint x;
  uint y;
  array<int,_4UL> value;
  size_t in_stack_ffffffffffffffb8;
  reference in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  value_type_conflict3 in_stack_ffffffffffffffcc;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  for (local_1c = 0;
      local_1c <
      *(uint *)((long)&(in_RDI->data).
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4); local_1c = local_1c + 1) {
    for (local_20 = 0;
        local_20 <
        *(uint *)&(in_RDI->data).
                  super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish; local_20 = local_20 + 1) {
      for (local_24 = 0; (ulong)local_24 < in_RDI->height; local_24 = local_24 + 1) {
        for (local_28 = 0; (int)local_28 < 4; local_28 = local_28 + 1) {
          in_stack_ffffffffffffffc0 =
               std::
               vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
               ::operator[]((vector<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                             *)&in_RDI->width,(ulong)local_24);
          get_opposite_direction(local_28);
          this_00 = std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>::
                    operator[](in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
          in_stack_ffffffffffffffcc = (value_type_conflict3)sVar1;
          pvVar2 = std::array<int,_4UL>::operator[]
                             ((array<int,_4UL> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                             );
          *pvVar2 = in_stack_ffffffffffffffcc;
        }
        paVar3 = Array3D<std::array<int,_4UL>_>::get
                           (in_RDI,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            (size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        *(undefined8 *)paVar3->_M_elems = local_18;
        *(undefined8 *)(paVar3->_M_elems + 2) = local_10;
      }
    }
  }
  return;
}

Assistant:

void Propagator::init_compatible() noexcept {
  std::array<int, 4> value;
  // We compute the number of pattern compatible in all directions.
  for (unsigned y = 0; y < wave_height; y++) {
    for (unsigned x = 0; x < wave_width; x++) {
      for (unsigned pattern = 0; pattern < patterns_size; pattern++) {
        for (int direction = 0; direction < 4; direction++) {
          value[direction] =
            static_cast<unsigned>(propagator_state[pattern][get_opposite_direction(direction)]
                                  .size());
        }
        compatible.get(y, x, pattern) = value;
      }
    }
  }
}